

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

bool __thiscall
MidiInApi::MidiQueue::pop
          (MidiQueue *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *msg,
          double *timeStamp)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = this->front;
  uVar3 = 0;
  iVar2 = this->back - uVar1;
  if (this->back < uVar1) {
    uVar3 = this->ringSize;
  }
  if (iVar2 != -uVar3) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)msg,
               this->ring[uVar1].bytes.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               this->ring[uVar1].bytes.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    *timeStamp = this->ring[uVar1].timeStamp;
    this->front = (this->front + 1) % this->ringSize;
  }
  return iVar2 != -uVar3;
}

Assistant:

bool MidiInApi::MidiQueue::pop( std::vector<unsigned char> *msg, double* timeStamp )
{
  // Local stack copies of front/back
  unsigned int _back, _front, _size;

  // Get back/front indexes exactly once and calculate current size
  _size = size( &_back, &_front );

  if ( _size == 0 )
    return false;

  // Copy queued message to the vector pointer argument and then "pop" it.
  msg->assign( ring[_front].bytes.begin(), ring[_front].bytes.end() );
  *timeStamp = ring[_front].timeStamp;

  // Update front
  front = (front+1)%ringSize;
  return true;
}